

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

bool dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::_addBidirectionalEdge
               (LLVMNode *ths,LLVMNode *n,EdgesT *ths_cont,EdgesT *n_cont)

{
  bool bVar1;
  LLVMNode *in_RDI;
  bool ret2;
  DGContainer<dg::LLVMNode_*,_4U> *unaff_retaddr;
  
  DGContainer<dg::LLVMNode_*,_4U>::insert(unaff_retaddr,in_RDI);
  bVar1 = DGContainer<dg::LLVMNode_*,_4U>::insert(unaff_retaddr,in_RDI);
  return bVar1;
}

Assistant:

static bool _addBidirectionalEdge(NodeT *ths, NodeT *n, EdgesT &ths_cont,
                                      EdgesT &n_cont) {
#ifndef NDEBUG
        bool ret1 =
#endif
                n_cont.insert(ths);
        bool ret2 = ths_cont.insert(n);

        assert(ret1 == ret2 &&
               "Already had one of the edges, but not the other");

        return ret2;
    }